

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.cpp
# Opt level: O1

sha1_hash * libtorrent::aux::hash_address(sha1_hash *__return_storage_ptr__,address *ip)

{
  hasher *this;
  bytes_type b_1;
  bytes_type b;
  hasher local_28;
  hasher local_20;
  undefined8 uStack_18;
  
  this = &local_28;
  if (ip->type_ == ipv6) {
    local_20.m_context = *(EVP_MD_CTX **)&(ip->ipv6_address_).addr_.__in6_u;
    uStack_18 = *(undefined8 *)((long)&(ip->ipv6_address_).addr_.__in6_u + 8);
    lcrypto::hasher::hasher(&local_28,(char *)&local_20,0x10);
    lcrypto::hasher::final(__return_storage_ptr__,&local_28);
  }
  else {
    if (ip->type_ != ipv4) {
      local_20.m_context = (EVP_MD_CTX *)&PTR__bad_cast_004ee530;
      boost::throw_exception<boost::asio::ip::bad_address_cast>((bad_address_cast *)&local_20);
    }
    local_28.m_context._0_4_ = (ip->ipv4_address_).addr_.s_addr;
    lcrypto::hasher::hasher(&local_20,(char *)&local_28,4);
    lcrypto::hasher::final(__return_storage_ptr__,&local_20);
    this = &local_20;
  }
  lcrypto::hasher::~hasher(this);
  return __return_storage_ptr__;
}

Assistant:

sha1_hash hash_address(address const& ip)
	{
		if (ip.is_v6())
		{
			address_v6::bytes_type b = ip.to_v6().to_bytes();
			return hasher(reinterpret_cast<char const*>(b.data()), int(b.size())).final();
		}
		else
		{
			address_v4::bytes_type b = ip.to_v4().to_bytes();
			return hasher(reinterpret_cast<char const*>(b.data()), int(b.size())).final();
		}
	}